

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

PHYSFS_EnumerateCallbackResult setSaneCfgEnumCallback(void *_data,char *dir,char *f)

{
  int iVar1;
  char *in_RAX;
  size_t sVar2;
  DirHandle *pDVar3;
  size_t sVar4;
  ulong *puVar5;
  ErrState *pEVar6;
  ulong *puVar7;
  ulong uVar8;
  long lVar9;
  char *__s;
  PHYSFS_ErrorCode PVar10;
  bool bVar11;
  
  puVar7 = (ulong *)&stack0xffffffffffffffc8;
  uVar8 = *(ulong *)((long)_data + 8);
  sVar2 = strlen(f);
  lVar9 = sVar2 - uVar8;
  if ((uVar8 <= sVar2 && lVar9 != 0) && (f[lVar9 + -1] == '.')) {
    iVar1 = PHYSFS_utf8stricmp(in_RAX,(char *)0x108710);
    if (iVar1 == 0) {
      pDVar3 = getRealDirHandle(f);
      if (pDVar3 == (DirHandle *)0x0) {
        __s = (char *)0x0;
      }
      else {
        __s = pDVar3->dirName;
      }
      sVar4 = strlen(__s);
      uVar8 = sVar4 + sVar2 + 2;
      if (uVar8 < 0x100) {
        puVar7 = (ulong *)(&stack0xffffffffffffffc8 + -(sVar4 + sVar2 + 0x19 & 0xfffffffffffffff0));
        puVar5 = puVar7;
      }
      else {
        puVar5 = (ulong *)0x0;
      }
      bVar11 = puVar5 == (ulong *)0x0;
      if (bVar11) {
        puVar7[-1] = 0x10878a;
        puVar5 = (ulong *)(*__PHYSFS_AllocatorHooks.Malloc)(sVar4 + sVar2 + 10);
      }
      if (puVar5 == (ulong *)0x0) {
        puVar5 = (ulong *)0x0;
      }
      else {
        *puVar5 = (ulong)bVar11;
        puVar5 = puVar5 + 1;
      }
      if (puVar5 == (ulong *)0x0) {
        *(undefined4 *)((long)_data + 0x14) = 2;
      }
      else {
        PVar10 = PHYSFS_ERR_OK;
        puVar7[-1] = 0x1087ca;
        snprintf((char *)puVar5,uVar8,"%s%c%s",__s,0x2f,f);
        iVar1 = *(int *)((long)_data + 0x10);
        puVar7[-1] = 0x1087df;
        iVar1 = doMount((PHYSFS_Io *)0x0,(char *)puVar5,(char *)0x0,(uint)(iVar1 == 0));
        if (iVar1 == 0) {
          puVar7[-1] = 0x1087e8;
          pEVar6 = findErrorForCurrentThread();
          if (pEVar6 != (ErrState *)0x0) {
            PVar10 = pEVar6->code;
          }
          *(PHYSFS_ErrorCode *)((long)_data + 0x14) = PVar10;
        }
        if (puVar5[-1] != 0) {
          puVar7[-1] = 0x10880d;
          (*__PHYSFS_AllocatorHooks.Free)(puVar5 + -1);
        }
      }
    }
  }
  return PHYSFS_ENUM_OK;
}

Assistant:

static PHYSFS_EnumerateCallbackResult setSaneCfgEnumCallback(void *_data,
                                                const char *dir, const char *f)
{
    setSaneCfgEnumData *data = (setSaneCfgEnumData *) _data;
    const size_t extlen = data->archiveExtLen;
    const size_t l = strlen(f);
    const char *ext;

    if ((l > extlen) && (f[l - extlen - 1] == '.'))
    {
        ext = f + (l - extlen);
        if (PHYSFS_utf8stricmp(ext, data->archiveExt) == 0)
        {
            const char dirsep = __PHYSFS_platformDirSeparator;
            const char *d = PHYSFS_getRealDir(f);
            const size_t allocsize = strlen(d) + l + 2;
            char *str = (char *) __PHYSFS_smallAlloc(allocsize);
            if (str == NULL)
                data->errcode = PHYSFS_ERR_OUT_OF_MEMORY;
            else
            {
                snprintf(str, allocsize, "%s%c%s", d, dirsep, f);
                if (!PHYSFS_mount(str, NULL, data->archivesFirst == 0))
                    data->errcode = currentErrorCode();
                __PHYSFS_smallFree(str);
            } /* else */
        } /* if */
    } /* if */

    /* !!! FIXME: if we want to abort on errors... */
    /*return (data->errcode != PHYSFS_ERR_OK) ? PHYSFS_ENUM_ERROR : PHYSFS_ENUM_OK;*/

    return PHYSFS_ENUM_OK;  /* keep going */
}